

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O0

my_rational sum_criticals(critical_level *head)

{
  uint local_50;
  my_rational local_40;
  my_rational pr_not_this;
  my_rational local_28;
  my_rational level_added_dice;
  my_rational remaining_chance;
  critical_level *head_local;
  my_rational added_dice;
  
  level_added_dice = my_rational_construct(1,1);
  head_local = (critical_level *)my_rational_construct(0,1);
  for (remaining_chance = (my_rational)head; remaining_chance != (my_rational)0x0;
      remaining_chance = *(my_rational *)remaining_chance) {
    if (*(long *)remaining_chance == 0) {
      local_50 = 1;
    }
    else {
      local_50 = *(uint *)((long)remaining_chance + 8);
    }
    local_28 = my_rational_construct(*(uint *)((long)remaining_chance + 0xc),local_50);
    local_28 = my_rational_product(&local_28,&level_added_dice);
    pr_not_this = my_rational_sum((my_rational *)&head_local,&local_28);
    head_local = (critical_level *)pr_not_this;
    if (*(long *)remaining_chance != 0) {
      local_40 = my_rational_construct
                           (*(int *)((long)remaining_chance + 8) - 1,
                            *(uint *)((long)remaining_chance + 8));
      level_added_dice = my_rational_product(&level_added_dice,&local_40);
    }
  }
  return (my_rational)head_local;
}

Assistant:

static struct my_rational sum_criticals(const struct critical_level *head)
{
	struct my_rational remaining_chance = my_rational_construct(1, 1);
	struct my_rational added_dice = my_rational_construct(0, 1);

	while (head) {
		/* The last level of criticals takes all the remainder. */
		struct my_rational level_added_dice = my_rational_construct(
			head->added_dice, (head->next) ? head->chance : 1);

		level_added_dice = my_rational_product(&level_added_dice,
			&remaining_chance);
		added_dice = my_rational_sum(&added_dice, &level_added_dice);
		if (head->next) {
			struct my_rational pr_not_this = my_rational_construct(
				head->chance - 1, head->chance);

			remaining_chance = my_rational_product(
				&remaining_chance, &pr_not_this);
		}
		head = head->next;
	}

	return added_dice;
}